

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O3

void __thiscall OpenMD::CubicSpline::generate(CubicSpline *this)

{
  ulong uVar1;
  pointer pdVar2;
  pointer pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  bool bVar7;
  int iVar8;
  double *pdVar9;
  long lVar10;
  CubicSpline *pCVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  double *pdVar15;
  ulong uVar16;
  bool bVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  vector<int,_std::allocator<int>_> p;
  vector<double,_std::allocator<double>_> local_58;
  vector<int,_std::allocator<int>_> local_38;
  
  iVar8 = (int)((ulong)((long)(this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_finish -
                       (long)(this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  this->n = iVar8;
  std::vector<double,_std::allocator<double>_>::resize(&this->b,(long)iVar8);
  std::vector<double,_std::allocator<double>_>::resize(&this->c,(long)this->n);
  pCVar11 = (CubicSpline *)(long)this->n;
  std::vector<double,_std::allocator<double>_>::resize(&this->d,(size_type)pCVar11);
  uVar12 = this->n;
  pdVar9 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (1 < (long)(int)uVar12) {
    bVar17 = true;
    lVar10 = 1;
    do {
      bVar7 = 0.0 < pdVar9[lVar10] - pdVar9[lVar10 + -1];
      pCVar11 = (CubicSpline *)CONCAT71((int7)((ulong)pCVar11 >> 8),bVar7);
      bVar17 = (bool)(bVar17 & bVar7);
      lVar10 = lVar10 + 1;
    } while ((int)uVar12 != lVar10);
    if (!bVar17) {
      sort_permutation(&local_38,pCVar11,&this->x_);
      apply_permutation(&local_58,pCVar11,&this->x_,&local_38);
      pdVar2 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pCVar11 = (CubicSpline *)
                (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
      (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage =
           local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (pdVar2 != (pointer)0x0) {
        pCVar11 = (CubicSpline *)((long)pCVar11 - (long)pdVar2);
        operator_delete(pdVar2,(ulong)pCVar11);
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          pCVar11 = (CubicSpline *)
                    ((long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,(ulong)pCVar11);
        }
      }
      apply_permutation(&local_58,pCVar11,&this->y_,&local_38);
      pdVar2 = (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
      (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage =
           local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if ((pdVar2 != (pointer)0x0) &&
         (operator_delete(pdVar2,(long)pdVar3 - (long)pdVar2),
         local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pdVar9 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar12 = this->n;
    }
  }
  dVar18 = pdVar9[1];
  dVar20 = *pdVar9;
  pdVar4 = (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar4 = dVar18 - dVar20;
  pdVar5 = (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (this->c).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar6 = (pdVar5[1] - *pdVar5) / (dVar18 - dVar20);
  if (uVar12 == 2) {
    *pdVar4 = 0.0;
    dVar18 = (pdVar5[1] - *pdVar5) / (pdVar9[1] - *pdVar9);
    *pdVar6 = dVar18 * dVar18 * -3.0;
    dVar18 = pow((pdVar5[1] - *pdVar5) / (pdVar9[1] - *pdVar9),3.0);
    pdVar2 = (this->d).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    *pdVar2 = dVar18 * -2.0;
    pdVar3 = (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[1] = *pdVar3;
    (this->c).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = 0.0;
    pdVar2[1] = 0.0;
    pdVar9 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    this->dx = 1.0 / (pdVar9[1] - *pdVar9);
    this->isUniform = true;
    goto LAB_0025e1e0;
  }
  pdVar2 = (this->d).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar2 = *pdVar4 + *pdVar4;
  uVar13 = uVar12 - 1;
  if (2 < (int)uVar12) {
    lVar10 = 0;
    do {
      dVar18 = *(double *)((long)pdVar9 + lVar10 + 0x10) - *(double *)((long)pdVar9 + lVar10 + 8);
      *(double *)((long)pdVar4 + lVar10 + 8) = dVar18;
      if (1e-05 < ABS(dVar18 - *pdVar4) / *pdVar4) {
        this->isUniform = false;
      }
      *(double *)((long)pdVar6 + lVar10 + 8) =
           (*(double *)((long)pdVar5 + lVar10 + 0x10) - *(double *)((long)pdVar5 + lVar10 + 8)) /
           dVar18;
      dVar18 = *(double *)((long)pdVar4 + lVar10 + 8) + *(double *)((long)pdVar4 + lVar10);
      *(double *)((long)pdVar2 + lVar10 + 8) = dVar18 + dVar18;
      lVar10 = lVar10 + 8;
    } while ((ulong)uVar13 * 8 + -8 != lVar10);
  }
  lVar10 = (long)(int)uVar12;
  uVar1 = lVar10 - 2;
  pdVar2[(int)uVar13] = pdVar4[lVar10 + -2] + pdVar4[lVar10 + -2];
  dVar18 = *pdVar6;
  dVar20 = pdVar6[1];
  dVar21 = *pdVar4;
  dVar22 = dVar21 + pdVar4[1];
  dVar19 = dVar18 - ((dVar20 - dVar18) * dVar21) / dVar22;
  if (3 < (int)uVar12) {
    dVar19 = dVar19 + (dVar21 * (dVar18 + ((dVar22 * (pdVar6[2] - dVar20)) / (pdVar4[1] + pdVar4[2])
                                          - dVar20))) / (pdVar9[3] - *pdVar9);
  }
  dVar18 = pdVar6[uVar1];
  dVar21 = dVar18 - pdVar6[lVar10 + -3];
  dVar22 = pdVar4[uVar1] + pdVar4[lVar10 + -3];
  dVar20 = (pdVar4[uVar1] * dVar21) / dVar22 + dVar18;
  if ((int)uVar12 < 4) {
    pdVar6[(int)uVar13] = (dVar20 - dVar18) * 3.0;
    if (2 < (int)uVar12) goto LAB_0025e00e;
  }
  else {
    uVar14 = uVar12 - 4;
    pdVar6[(int)uVar13] =
         ((dVar20 + ((dVar21 - (dVar22 * (pdVar6[lVar10 + -3] - pdVar6[uVar14])) /
                               (pdVar4[lVar10 + -3] + pdVar4[uVar14])) * pdVar4[uVar1 & 0xffffffff])
                    / (pdVar9[(int)uVar13] - pdVar9[uVar14])) - dVar18) * 3.0;
LAB_0025e00e:
    uVar16 = (uVar1 & 0xffffffff) + 1;
    dVar18 = pdVar6[uVar1 & 0xffffffff];
    do {
      dVar20 = pdVar6[uVar16 - 2];
      pdVar6[uVar16 - 1] = (dVar18 - dVar20) * 3.0;
      uVar16 = uVar16 - 1;
      dVar18 = dVar20;
    } while (1 < uVar16);
  }
  pdVar15 = pdVar6 + (int)uVar13;
  *pdVar6 = (*pdVar6 - dVar19) * 3.0;
  if ((int)uVar12 < 2) {
    *pdVar15 = *pdVar15 / pdVar2[(int)uVar13];
    dVar18 = 0.0;
  }
  else {
    lVar10 = 0;
    do {
      dVar18 = -pdVar4[lVar10] / pdVar2[lVar10];
      pdVar2[lVar10 + 1] = pdVar4[lVar10] * dVar18 + pdVar2[lVar10 + 1];
      pdVar6[lVar10 + 1] = dVar18 * pdVar6[lVar10] + pdVar6[lVar10 + 1];
      lVar10 = lVar10 + 1;
    } while ((ulong)uVar12 - 1 != lVar10);
    *pdVar15 = *pdVar15 / pdVar2[(int)uVar13];
    dVar18 = 0.0;
    if (1 < (int)uVar12) {
      uVar16 = uVar1 & 0xffffffff;
      dVar20 = pdVar6[uVar16 + 1];
      do {
        dVar20 = (pdVar6[uVar16] - dVar20 * pdVar4[uVar16]) / pdVar2[uVar16];
        pdVar6[uVar16] = dVar20;
        bVar17 = uVar16 != 0;
        uVar16 = uVar16 - 1;
      } while (bVar17);
      if (1 < (int)uVar12) {
        uVar16 = 0;
        do {
          dVar18 = pdVar9[uVar16 + 1] - pdVar9[uVar16];
          dVar20 = (pdVar6[uVar16 + 1] - pdVar6[uVar16]) / (dVar18 * 3.0);
          pdVar2[uVar16] = dVar20;
          pdVar4[uVar16] =
               (pdVar5[uVar16 + 1] - pdVar5[uVar16]) / dVar18 -
               (dVar20 * dVar18 + pdVar6[uVar16]) * dVar18;
          uVar16 = uVar16 + 1;
        } while (uVar13 != uVar16);
      }
    }
  }
  pdVar4[(int)uVar13] =
       (pdVar6[uVar1] + pdVar6[uVar1] + dVar18 * 3.0 * pdVar2[uVar1]) * dVar18 + pdVar4[uVar1];
  if (this->isUniform != false) {
    this->dx = 1.0 / (pdVar9[1] - *pdVar9);
  }
LAB_0025e1e0:
  this->generated = true;
  return;
}

Assistant:

void CubicSpline::generate() {
    // Calculate coefficients defining a smooth cubic interpolatory spline.
    //
    // class values constructed:
    //   n   = number of data_ points.
    //   x_  = vector of independent variable values
    //   y_  = vector of dependent variable values
    //   b   = vector of S'(x_[i]) values.
    //   c   = vector of S"(x_[i])/2 values.
    //   d   = vector of S'''(x_[i]+)/6 values (i < n).
    // Local variables:

    RealType fp1, fpn, p;
    RealType h(0.0);

    // make sure the sizes match

    n = x_.size();
    b.resize(n);
    c.resize(n);
    d.resize(n);

    // make sure we are monotonically increasing in x:

    bool sorted = true;

    for (int i = 1; i < n; i++) {
      if ((x_[i] - x_[i - 1]) <= 0.0) sorted = false;
    }

    // sort if necessary

    if (!sorted) {
      std::vector<int> p = sort_permutation(x_);
      x_                 = apply_permutation(x_, p);
      y_                 = apply_permutation(y_, p);
    }

    // Calculate coefficients for the tridiagonal system: store
    // sub-diagonal in B, diagonal in D, difference quotient in C.

    b[0] = x_[1] - x_[0];
    c[0] = (y_[1] - y_[0]) / b[0];

    if (n == 2) {
      // Assume the derivatives at both endpoints are zero. Another
      // assumption could be made to have a linear interpolant between
      // the two points.  In that case, the b coefficients below would be
      // (y_[1] - y_[0]) / (x_[1] - x_[0])
      // and the c and d coefficients would both be zero.
      b[0]      = 0.0;
      c[0]      = -3.0 * pow((y_[1] - y_[0]) / (x_[1] - x_[0]), 2);
      d[0]      = -2.0 * pow((y_[1] - y_[0]) / (x_[1] - x_[0]), 3);
      b[1]      = b[0];
      c[1]      = 0.0;
      d[1]      = 0.0;
      dx        = 1.0 / (x_[1] - x_[0]);
      isUniform = true;
      generated = true;
      return;
    }

    d[0] = 2.0 * b[0];

    for (int i = 1; i < n - 1; i++) {
      b[i] = x_[i + 1] - x_[i];
      if (fabs(b[i] - b[0]) / b[0] > 1.0e-5) isUniform = false;
      c[i] = (y_[i + 1] - y_[i]) / b[i];
      d[i] = 2.0 * (b[i] + b[i - 1]);
    }

    d[n - 1] = 2.0 * b[n - 2];

    // Calculate estimates for the end slopes using polynomials
    // that interpolate the data_ nearest the end.

    fp1 = c[0] - b[0] * (c[1] - c[0]) / (b[0] + b[1]);
    if (n > 3)
      fp1 = fp1 +
            b[0] *
                ((b[0] + b[1]) * (c[2] - c[1]) / (b[1] + b[2]) - c[1] + c[0]) /
                (x_[3] - x_[0]);

    fpn = c[n - 2] + b[n - 2] * (c[n - 2] - c[n - 3]) / (b[n - 3] + b[n - 2]);

    if (n > 3)
      fpn = fpn + b[n - 2] *
                      (c[n - 2] - c[n - 3] -
                       (b[n - 3] + b[n - 2]) * (c[n - 3] - c[n - 4]) /
                           (b[n - 3] + b[n - 4])) /
                      (x_[n - 1] - x_[n - 4]);

    // Calculate the right hand side and store it in C.

    c[n - 1] = 3.0 * (fpn - c[n - 2]);
    for (int i = n - 2; i > 0; i--)
      c[i] = 3.0 * (c[i] - c[i - 1]);
    c[0] = 3.0 * (c[0] - fp1);

    // Solve the tridiagonal system.

    for (int k = 1; k < n; k++) {
      p    = b[k - 1] / d[k - 1];
      d[k] = d[k] - p * b[k - 1];
      c[k] = c[k] - p * c[k - 1];
    }

    c[n - 1] = c[n - 1] / d[n - 1];

    for (int k = n - 2; k >= 0; k--)
      c[k] = (c[k] - b[k] * c[k + 1]) / d[k];

    // Calculate the coefficients defining the spline.

    for (int i = 0; i < n - 1; i++) {
      h    = x_[i + 1] - x_[i];
      d[i] = (c[i + 1] - c[i]) / (3.0 * h);
      b[i] = (y_[i + 1] - y_[i]) / h - h * (c[i] + h * d[i]);
    }

    b[n - 1] = b[n - 2] + h * (2.0 * c[n - 2] + h * 3.0 * d[n - 2]);

    if (isUniform) dx = 1.0 / (x_[1] - x_[0]);

    generated = true;
    return;
  }